

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void crnlib::crn_comp::append_vec(vector<unsigned_char> *a,void *p,uint size)

{
  uint i;
  uchar *__dest;
  uint ofs;
  uint size_local;
  void *p_local;
  vector<unsigned_char> *a_local;
  
  if (size != 0) {
    i = vector<unsigned_char>::size(a);
    vector<unsigned_char>::resize(a,i + size,false);
    __dest = vector<unsigned_char>::operator[](a,i);
    memcpy(__dest,p,(ulong)size);
  }
  return;
}

Assistant:

void crn_comp::append_vec(crnlib::vector<uint8>& a, const void* p, uint size) {
  if (size) {
    uint ofs = a.size();
    a.resize(ofs + size);

    memcpy(&a[ofs], p, size);
  }
}